

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O1

void __thiscall JsonNumber_One_Test::TestBody(JsonNumber_One_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypedExpectation<std::error_code_(unsigned_long)> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  AssertHelper local_f0;
  string local_e8;
  undefined1 local_c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  undefined1 local_b8 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b0;
  int local_60;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_e8,1);
  mock_json_callbacks::gmock_uint64_value
            ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
             &(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,
             (Matcher<unsigned_long> *)&local_e8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                      ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0x39,"callbacks_","uint64_value (1)");
  testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_00,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_b0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_e8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b8,
             (this->super_JsonNumber).proxy_.original_,none);
  paVar1 = &local_e8.field_2;
  local_e8.field_2._M_allocated_capacity._0_4_ = 0x203120;
  local_e8._M_string_length = 3;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_c8,3);
  local_c0 = paVar1;
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)local_b8,
                       (span<const_char,__1L> *)local_c8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                             local_e8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_c8[0] = local_60 == 0;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (local_60 != 0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_c8,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0x3c,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                               local_e8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b0);
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonNumber, One) {
    EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (" 1 "s).eof ();
    EXPECT_FALSE (p.has_error ());
}